

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_Mesh::WriteFaceArray(ON_Mesh *this,int vcount,int fcount,ON_BinaryArchive *file)

{
  ON_MeshFace *pOVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  int i;
  undefined1 auVar5 [16];
  uchar cvi [4];
  ON__UINT8 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined8 local_38;
  
  i = 1;
  if (0xff < vcount) {
    i = (0xffffU < (uint)vcount) + 2 + (uint)(0xffffU < (uint)vcount);
  }
  bVar2 = ON_BinaryArchive::WriteInt(file,i);
  if (i == 1) {
    if (bVar2 && 0 < fcount) {
      lVar4 = 0xc;
      uVar3 = 1;
      do {
        pOVar1 = (this->m_F).m_a;
        local_3c = *(ON__UINT8 *)((long)pOVar1->vi + lVar4 + -0xc);
        local_3b = *(undefined1 *)((long)pOVar1->vi + lVar4 + -8);
        local_3a = *(undefined1 *)((long)pOVar1->vi + lVar4 + -4);
        local_39 = *(undefined1 *)((long)pOVar1->vi + lVar4);
        bVar2 = ON_BinaryArchive::WriteChar(file,4,&local_3c);
        if ((uint)fcount <= uVar3) {
          return bVar2;
        }
        lVar4 = lVar4 + 0x10;
        uVar3 = uVar3 + 1;
      } while (bVar2);
    }
  }
  else if (i == 2) {
    if (bVar2 && 0 < fcount) {
      uVar3 = 1;
      lVar4 = 0;
      do {
        auVar5 = *(undefined1 (*) [16])((long)((this->m_F).m_a)->vi + lVar4);
        auVar5 = pshuflw(auVar5,auVar5,0xe8);
        auVar5 = pshufhw(auVar5,auVar5,0xe8);
        local_38 = CONCAT44(auVar5._8_4_,auVar5._0_4_);
        bVar2 = ON_BinaryArchive::WriteShort(file,4,(ON__UINT16 *)&local_38);
        if ((uint)fcount <= uVar3) {
          return bVar2;
        }
        lVar4 = lVar4 + 0x10;
        uVar3 = uVar3 + 1;
      } while (bVar2);
    }
  }
  else if ((i == 4) && (bVar2 && 0 < fcount)) {
    uVar3 = 1;
    lVar4 = 0;
    do {
      bVar2 = ON_BinaryArchive::WriteInt(file,4,(ON__INT32 *)((long)((this->m_F).m_a)->vi + lVar4));
      if ((uint)fcount <= uVar3) {
        return bVar2;
      }
      lVar4 = lVar4 + 0x10;
      uVar3 = uVar3 + 1;
    } while (bVar2);
  }
  return bVar2;
}

Assistant:

bool ON_Mesh::WriteFaceArray( int vcount, int fcount, ON_BinaryArchive& file ) const
{
  unsigned char  cvi[4];
  unsigned short svi[4];
  const int* vi;
  int i_size = 0;
  if ( vcount < 256 ) {
    i_size = 1; // unsigned chars
  }
  else if (vcount < 65536 ) {
    i_size = 2; // unsigned shorts
  }
  else {
    i_size = 4; // 4 byte ints
  }

  bool rc = file.WriteInt( i_size );
  int i;
  switch(i_size) {
  case 1:
    for ( i = 0; i < fcount && rc ; i++ ) {
      vi = m_F[i].vi;
      cvi[0] = (unsigned char)vi[0];
      cvi[1] = (unsigned char)vi[1];
      cvi[2] = (unsigned char)vi[2];
      cvi[3] = (unsigned char)vi[3];
      rc = file.WriteChar( 4, cvi );
    }
    break;
  case 2:
    for ( i = 0; i < fcount && rc ; i++ ) {
      vi = m_F[i].vi;
      svi[0] = (unsigned short)vi[0];
      svi[1] = (unsigned short)vi[1];
      svi[2] = (unsigned short)vi[2];
      svi[3] = (unsigned short)vi[3];
      rc = file.WriteShort( 4, svi );
    }
    break;
  case 4:
    for ( i = 0; i < fcount && rc ; i++ ) {
      rc = file.WriteInt( 4, m_F[i].vi );
    }
    break;
  }

  return rc;
}